

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAllocPtr alloc)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  UInt32 UVar4;
  uint uVar5;
  Byte *pBVar6;
  ulong uVar7;
  CLzRef *pCVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  
  uVar3 = historySize + keepAddBufferBefore + 1;
  p->keepSizeBefore = uVar3;
  uVar5 = keepAddBufferAfter + matchMaxLen;
  if (keepAddBufferAfter + matchMaxLen <= p->numHashBytes) {
    uVar5 = p->numHashBytes;
  }
  p->keepSizeAfter = uVar5;
  if (p->directInput == '\0') {
    uVar11 = uVar5 + uVar3;
    uVar12 = 0;
    if (historySize <= uVar3 && !CARRY4(uVar5,uVar3)) {
      uVar5 = uVar11 >> (2U - (uVar11 < 0x40000000) & 0x1f);
      uVar12 = uVar5 + uVar11 + 0x11080 & 0xffff0000;
      if (-(uVar11 + 0x10000) <= uVar5 + 0x11080) {
        uVar12 = 0xffff0000;
      }
      if (-(uVar11 + 0x10000) < 0x1000000) {
        uVar12 = 0;
      }
      if (0xfffeffff < uVar11) {
        uVar12 = 0;
      }
    }
    if (uVar12 == 0) goto LAB_00195f51;
    if ((p->bufBase == (Byte *)0x0) || (p->blockSize != uVar12)) {
      (*alloc->Free)(alloc,p->bufBase);
      p->bufBase = (Byte *)0x0;
      p->blockSize = uVar12;
      pBVar6 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar12);
      p->bufBase = pBVar6;
    }
    if (p->bufBase == (Byte *)0x0) goto LAB_00195f51;
  }
  else {
    p->blockSize = 0;
  }
  bVar1 = p->numHashOutBits;
  if (bVar1 == 0) {
    uVar5 = MatchFinder_GetHashMask(p,historySize);
    uVar13 = (ulong)uVar5;
    if ((ulong)historySize <= p->expectedDataSize) goto LAB_00195e91;
    UVar4 = MatchFinder_GetHashMask(p,(UInt32)p->expectedDataSize);
    if (UVar4 < uVar5) {
      uVar5 = UVar4;
    }
  }
  else {
    uVar5 = p->numHashBytes;
    bVar9 = 0x10;
    if (uVar5 != 2) {
      bVar9 = (uVar5 != 3) * '\b' + 0x18;
    }
    if (bVar1 <= bVar9) {
      bVar9 = bVar1;
    }
    uVar3 = ~(-1 << (bVar9 & 0x1f)) | 0xffff;
    if (0x1f < bVar9) {
      uVar3 = 0xffffffff;
    }
    uVar12 = uVar3 | 0x3ffff;
    if (uVar5 < 5) {
      uVar12 = uVar3;
    }
    UVar4 = MatchFinder_GetHashMask2(p,historySize);
    if (UVar4 <= uVar12) {
      uVar12 = UVar4;
    }
    uVar13 = (ulong)uVar12;
    if (p->expectedDataSize < (ulong)historySize) {
      uVar5 = MatchFinder_GetHashMask2(p,(UInt32)p->expectedDataSize);
      if (uVar12 < uVar5) {
        uVar5 = uVar12;
      }
    }
    else {
LAB_00195e91:
      uVar5 = (uint)uVar13;
    }
  }
  p->hashMask = uVar5;
  uVar10 = 0;
  if (2 < p->numHashBytes) {
    uVar10 = (ulong)(p->numHashBytes_Min < 3) << 10;
  }
  uVar7 = uVar10;
  if ((3 < p->numHashBytes) && (uVar7 = (ulong)((int)uVar10 + 0x10000), 3 < p->numHashBytes_Min)) {
    uVar7 = uVar10;
  }
  p->fixedHashSize = (UInt32)uVar7;
  p->matchMaxLen = matchMaxLen;
  p->historySize = historySize;
  uVar5 = historySize + 1;
  p->cyclicBufferSize = uVar5;
  uVar10 = (ulong)uVar5 << (p->btMode != '\0');
  iVar15 = 0;
  if (uVar10 < uVar5) {
LAB_00195f4b:
    bVar2 = false;
  }
  else {
    lVar14 = uVar7 + uVar13 + 1;
    uVar13 = lVar14 + uVar10 + 0xf & 0xfffffffffffffff0;
    if ((p->hash != (CLzRef *)0x0) && (uVar13 <= p->numRefs)) {
LAB_00195f45:
      iVar15 = 1;
      goto LAB_00195f4b;
    }
    (*alloc->Free)(alloc,p->hash);
    p->hash = (CLzRef *)0x0;
    p->numRefs = uVar13;
    pCVar8 = (CLzRef *)(*alloc->Alloc)(alloc,uVar13 << 2);
    p->hash = pCVar8;
    if (pCVar8 != (CLzRef *)0x0) {
      p->son = pCVar8 + lVar14;
      goto LAB_00195f45;
    }
    bVar2 = true;
  }
  if (!bVar2) {
    return iVar15;
  }
LAB_00195f51:
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  (*alloc->Free)(alloc,p->bufBase);
  p->bufBase = (Byte *)0x0;
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAllocPtr alloc)
{
  /* we need one additional byte in (p->keepSizeBefore),
     since we use MoveBlock() after (p->pos++) and before dictionary using */
  // keepAddBufferBefore = (UInt32)0xFFFFFFFF - (1 << 22); // for debug
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;

  keepAddBufferAfter += matchMaxLen;
  /* we need (p->keepSizeAfter >= p->numHashBytes) */
  if (keepAddBufferAfter < p->numHashBytes)
    keepAddBufferAfter = p->numHashBytes;
  // keepAddBufferAfter -= 2; // for debug
  p->keepSizeAfter = keepAddBufferAfter;

  if (p->directInput)
    p->blockSize = 0;
  if (p->directInput || LzInWindow_Create2(p, GetBlockSize(p, historySize), alloc))
  {
    size_t hashSizeSum;
    {
      UInt32 hs;
      UInt32 hsCur;
      
      if (p->numHashOutBits != 0)
      {
        unsigned numBits = p->numHashOutBits;
        const unsigned nbMax =
            (p->numHashBytes == 2 ? 16 :
            (p->numHashBytes == 3 ? 24 : 32));
        if (numBits > nbMax)
          numBits = nbMax;
        if (numBits >= 32)
          hs = (UInt32)0 - 1;
        else
          hs = ((UInt32)1 << numBits) - 1;
        // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
        hs |= (1 << 16) - 1; /* don't change it! */
        if (p->numHashBytes >= 5)
          hs |= (256 << kLzHash_CrcShift_2) - 1;
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, historySize);
          if (hs > hs2)
            hs = hs2;
        }
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs2)
            hsCur = hs2;
        }
      }
      else
      {
        hs = MatchFinder_GetHashMask(p, historySize);
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          hsCur = MatchFinder_GetHashMask(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs) // is it possible?
            hsCur = hs;
        }
      }

      p->hashMask = hsCur;

      hashSizeSum = hs;
      hashSizeSum++;
      if (hashSizeSum < hs)
        return 0;
      {
        UInt32 fixedHashSize = 0;
        if (p->numHashBytes > 2 && p->numHashBytes_Min <= 2) fixedHashSize += kHash2Size;
        if (p->numHashBytes > 3 && p->numHashBytes_Min <= 3) fixedHashSize += kHash3Size;
        // if (p->numHashBytes > 4) p->fixedHashSize += hs4; // kHash4Size;
        hashSizeSum += fixedHashSize;
        p->fixedHashSize = fixedHashSize;
      }
    }

    p->matchMaxLen = matchMaxLen;

    {
      size_t newSize;
      size_t numSons;
      const UInt32 newCyclicBufferSize = historySize + 1; // do not change it
      p->historySize = historySize;
      p->cyclicBufferSize = newCyclicBufferSize; // it must be = (historySize + 1)
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hashSizeSum + numSons;

      if (numSons < newCyclicBufferSize || newSize < numSons)
        return 0;

      // aligned size is not required here, but it can be better for some loops
      #define NUM_REFS_ALIGN_MASK 0xF
      newSize = (newSize + NUM_REFS_ALIGN_MASK) & ~(size_t)NUM_REFS_ALIGN_MASK;

      // 22.02: we don't reallocate buffer, if old size is enough
      if (p->hash && p->numRefs >= newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}